

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZShapeHCurlNoGrads.cpp
# Opt level: O0

void TPZShapeHCurlNoGrads<pzshape::TPZShapeCube>::Shape
               (TPZVec<double> *pt,TPZShapeData *data,TPZFMatrix<double> *phi,
               TPZFMatrix<double> *curlphi)

{
  int iVar1;
  int *piVar2;
  double *pdVar3;
  int64_t iVar4;
  long in_RSI;
  double dVar5;
  int x_3;
  int x_2;
  int fi;
  int ifunc;
  int64_t newfuncs;
  TPZVec<int> filtVecShape;
  int x_1;
  int x;
  int fss;
  int ie;
  int fcount;
  TPZFMatrix<double> curlphi_unfilt;
  TPZFMatrix<double> phi_unfilt;
  int i;
  int n_unfilt;
  TPZManVector<int,_19> first_hcurl_side;
  TPZManVector<int,_27> *connectorders;
  int nedges;
  int curldim;
  int dim;
  int ncon;
  int nsides;
  int ncorner;
  TPZManVector<int,_19> *in_stack_fffffffffffffd00;
  double *in_stack_fffffffffffffd10;
  _func_int **in_stack_fffffffffffffd18;
  TPZFMatrix<double> *in_stack_fffffffffffffd20;
  int64_t in_stack_fffffffffffffd28;
  TPZManVector<int,_19> *in_stack_fffffffffffffd30;
  int64_t in_stack_fffffffffffffd38;
  TPZFMatrix<double> *in_stack_fffffffffffffd40;
  TPZFMatrix<double> *in_stack_fffffffffffffd68;
  TPZFMatrix<double> *in_stack_fffffffffffffd70;
  TPZShapeData *in_stack_fffffffffffffd78;
  TPZVec<double> *in_stack_fffffffffffffd80;
  int local_238;
  int local_234;
  int local_22c;
  TPZVec<int> *in_stack_fffffffffffffdf0;
  TPZVec<int> *in_stack_fffffffffffffdf8;
  undefined4 in_stack_fffffffffffffe00;
  int in_stack_fffffffffffffe04;
  int local_1f8;
  int local_1f0;
  int local_c8;
  int local_b8;
  TPZVec<int> local_b0 [3];
  TPZVec<int> *local_40;
  int local_38;
  undefined4 local_34;
  undefined4 local_30;
  undefined4 local_2c;
  undefined4 local_28;
  undefined4 local_24;
  long local_10;
  
  local_24 = 8;
  local_28 = 0x1b;
  local_2c = 0x13;
  local_30 = 3;
  local_34 = 3;
  local_10 = in_RSI;
  local_38 = pztopology::TPZCube::NumSides(0x18d5538);
  local_40 = (TPZVec<int> *)(local_10 + 0x2b50);
  TPZManVector<int,_19>::TPZManVector
            (in_stack_fffffffffffffd30,in_stack_fffffffffffffd28,(int *)in_stack_fffffffffffffd20);
  TPZVec<int>::operator[](local_40,0);
  local_b8 = TPZShapeHCurl<pzshape::TPZShapeCube>::ComputeNConnectShapeF
                       ((int)in_stack_fffffffffffffd30,
                        (int)((ulong)in_stack_fffffffffffffd28 >> 0x20));
  for (local_c8 = 1; local_c8 < 0x13; local_c8 = local_c8 + 1) {
    piVar2 = TPZVec<int>::operator[](local_b0,(long)local_c8);
    *piVar2 = local_b8;
    TPZVec<int>::operator[](local_40,(long)local_c8);
    iVar1 = TPZShapeHCurl<pzshape::TPZShapeCube>::ComputeNConnectShapeF
                      ((int)in_stack_fffffffffffffd30,
                       (int)((ulong)in_stack_fffffffffffffd28 >> 0x20));
    local_b8 = iVar1 + local_b8;
  }
  TPZFMatrix<double>::TPZFMatrix
            (in_stack_fffffffffffffd40,in_stack_fffffffffffffd38,(int64_t)in_stack_fffffffffffffd30)
  ;
  TPZFMatrix<double>::TPZFMatrix
            (in_stack_fffffffffffffd40,in_stack_fffffffffffffd38,(int64_t)in_stack_fffffffffffffd30)
  ;
  TPZShapeHCurl<pzshape::TPZShapeCube>::Shape
            (in_stack_fffffffffffffd80,in_stack_fffffffffffffd78,in_stack_fffffffffffffd70,
             in_stack_fffffffffffffd68);
  for (local_1f0 = 0; local_1f0 < local_38; local_1f0 = local_1f0 + 1) {
    TPZVec<int>::operator[](local_b0,(long)local_1f0);
    for (local_1f8 = 0; local_1f8 < 3; local_1f8 = local_1f8 + 1) {
      pdVar3 = TPZFMatrix<double>::operator()
                         (in_stack_fffffffffffffd20,(int64_t)in_stack_fffffffffffffd18,
                          (int64_t)in_stack_fffffffffffffd10);
      dVar5 = *pdVar3;
      pdVar3 = TPZFMatrix<double>::operator()
                         (in_stack_fffffffffffffd20,(int64_t)in_stack_fffffffffffffd18,
                          (int64_t)in_stack_fffffffffffffd10);
      dVar5 = dVar5 + *pdVar3;
      pdVar3 = TPZFMatrix<double>::operator()
                         (in_stack_fffffffffffffd20,(int64_t)in_stack_fffffffffffffd18,
                          (int64_t)in_stack_fffffffffffffd10);
      *pdVar3 = dVar5;
    }
    for (in_stack_fffffffffffffe04 = 0; in_stack_fffffffffffffe04 < 3;
        in_stack_fffffffffffffe04 = in_stack_fffffffffffffe04 + 1) {
      pdVar3 = TPZFMatrix<double>::operator()
                         (in_stack_fffffffffffffd20,(int64_t)in_stack_fffffffffffffd18,
                          (int64_t)in_stack_fffffffffffffd10);
      dVar5 = *pdVar3;
      pdVar3 = TPZFMatrix<double>::operator()
                         (in_stack_fffffffffffffd20,(int64_t)in_stack_fffffffffffffd18,
                          (int64_t)in_stack_fffffffffffffd10);
      dVar5 = dVar5 + *pdVar3;
      pdVar3 = TPZFMatrix<double>::operator()
                         (in_stack_fffffffffffffd20,(int64_t)in_stack_fffffffffffffd18,
                          (int64_t)in_stack_fffffffffffffd10);
      *pdVar3 = dVar5;
    }
  }
  TPZVec<int>::TPZVec((TPZVec<int> *)&stack0xfffffffffffffde0);
  HighOrderFunctionsFilter
            ((TPZVec<int> *)CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00),
             in_stack_fffffffffffffdf8,in_stack_fffffffffffffdf0);
  iVar4 = TPZVec<int>::size((TPZVec<int> *)&stack0xfffffffffffffde0);
  for (local_22c = 0; local_22c < iVar4; local_22c = local_22c + 1) {
    TPZVec<int>::operator[]((TPZVec<int> *)&stack0xfffffffffffffde0,(long)local_22c);
    for (local_234 = 0; local_234 < 3; local_234 = local_234 + 1) {
      pdVar3 = TPZFMatrix<double>::operator()
                         (in_stack_fffffffffffffd20,(int64_t)in_stack_fffffffffffffd18,
                          (int64_t)in_stack_fffffffffffffd10);
      in_stack_fffffffffffffd18 = (_func_int **)*pdVar3;
      in_stack_fffffffffffffd20 =
           (TPZFMatrix<double> *)
           TPZFMatrix<double>::operator()
                     (in_stack_fffffffffffffd20,(int64_t)in_stack_fffffffffffffd18,
                      (int64_t)in_stack_fffffffffffffd10);
      (in_stack_fffffffffffffd20->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable.
      _vptr_TPZSavable = in_stack_fffffffffffffd18;
    }
    for (local_238 = 0; local_238 < 3; local_238 = local_238 + 1) {
      in_stack_fffffffffffffd10 =
           TPZFMatrix<double>::operator()
                     (in_stack_fffffffffffffd20,(int64_t)in_stack_fffffffffffffd18,
                      (int64_t)in_stack_fffffffffffffd10);
      in_stack_fffffffffffffd00 = (TPZManVector<int,_19> *)*in_stack_fffffffffffffd10;
      pdVar3 = TPZFMatrix<double>::operator()
                         (in_stack_fffffffffffffd20,(int64_t)in_stack_fffffffffffffd18,
                          (int64_t)in_stack_fffffffffffffd10);
      *pdVar3 = (double)in_stack_fffffffffffffd00;
    }
  }
  TPZVec<int>::~TPZVec(&in_stack_fffffffffffffd00->super_TPZVec<int>);
  TPZFMatrix<double>::~TPZFMatrix((TPZFMatrix<double> *)0x18d5ba8);
  TPZFMatrix<double>::~TPZFMatrix((TPZFMatrix<double> *)0x18d5bb5);
  TPZManVector<int,_19>::~TPZManVector(in_stack_fffffffffffffd00);
  return;
}

Assistant:

void TPZShapeHCurlNoGrads<TSHAPE>::Shape(TPZVec<REAL> &pt, TPZShapeData &data, TPZFMatrix<REAL> &phi, TPZFMatrix<REAL> &curlphi)
{

    constexpr int ncorner = TSHAPE::NCornerNodes;
    constexpr int nsides = TSHAPE::NSides;
    constexpr int ncon = nsides - ncorner;
    constexpr int dim = TSHAPE::Dimension;
    constexpr int curldim = [dim](){
        if constexpr (dim == 1) return 1;
        else{
            return 2*dim - 3;//1 for 2D 3 for 3D
        }
    }();
    const int nedges = TSHAPE::NumSides(1);
    
    //calculates # of unfiltered hcurl functions
    const auto &connectorders = data.fHDivConnectOrders;
    //first_hcurl_side[i] is the index of the first shape function associated with side i
    TPZManVector<int,ncon> first_hcurl_side(ncon,0);
    //total number of unfiltered funcs
    int n_unfilt = 0;

    {
      n_unfilt += TPZShapeHCurl<TSHAPE>::ComputeNConnectShapeF(0,connectorders[0]);
      for (int i = 1; i < ncon; i++){
        first_hcurl_side[i] = n_unfilt;
        n_unfilt += TPZShapeHCurl<TSHAPE>::ComputeNConnectShapeF(i,connectorders[i]);
      }
    }
    
    //computes  unfiltered hcurl funcs
    TPZFMatrix<REAL> phi_unfilt(dim,n_unfilt), curlphi_unfilt(curldim,n_unfilt);
    TPZShapeHCurl<TSHAPE>::Shape(pt, data, phi_unfilt, curlphi_unfilt);

    //now we filter the functions
    int fcount = 0;
    //edges: we sum the lowest order functions on the edge
    for(auto ie = 0; ie < nedges; ie++){
      //fss = first side shape
      const auto fss = first_hcurl_side[ie];
      for(auto x = 0; x < dim; x++){
        phi(x,fcount) = phi_unfilt(x,fss) + phi_unfilt(x,fss+1);
      }
      for(auto x = 0; x < curldim; x++){
        curlphi(x,fcount) = curlphi_unfilt(x,fss) + curlphi_unfilt(x,fss+1);
      }
      fcount++;
    }
    if constexpr (dim < 2) return;

    TPZVec<int> filtVecShape;
    HighOrderFunctionsFilter(first_hcurl_side, connectorders,filtVecShape);

    const auto newfuncs = filtVecShape.size();
    
    for(int ifunc = 0; ifunc < newfuncs; ifunc++){
      const auto fi = filtVecShape[ifunc];
      for(auto x = 0; x < curldim; x++){
        curlphi(x,fcount) = curlphi_unfilt(x,fi);
      }
      for(auto x = 0; x < dim; x++){
        phi(x,fcount) = phi_unfilt(x,fi);
      }
      fcount++;
    } 
    
    
}